

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QTextEdit::ExtraSelection*>,long_long>
               (reverse_iterator<QTextEdit::ExtraSelection_*> first,longlong n,
               reverse_iterator<QTextEdit::ExtraSelection_*> d_first)

{
  ExtraSelection *pEVar1;
  ExtraSelection *pEVar2;
  reverse_iterator<QTextEdit::ExtraSelection_*> *prVar3;
  ExtraSelection *pEVar4;
  ExtraSelection *pEVar5;
  ExtraSelection *this;
  long in_FS_OFFSET;
  Destructor local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar5 = *d_first.current;
  pEVar1 = pEVar5 + -n;
  this = *first.current;
  local_50.end.current = pEVar5;
  pEVar2 = pEVar1;
  pEVar4 = this;
  if (pEVar1 < this) {
    pEVar2 = this;
    pEVar4 = pEVar1;
  }
  while (pEVar5 != pEVar2) {
    QTextCursor::QTextCursor(&pEVar5[-1].cursor,&this[-1].cursor);
    QTextFormat::QTextFormat
              (&pEVar5[-1].format.super_QTextFormat,&this[-1].format.super_QTextFormat);
    *(long *)d_first.current = *(long *)d_first.current + -0x18;
    this = (ExtraSelection *)(*(long *)first.current - 0x18);
    *(ExtraSelection **)first.current = this;
    pEVar5 = *d_first.current;
  }
  local_50.iter = &local_50.intermediate;
  local_50.intermediate.current = pEVar5;
  while (prVar3 = &local_50.end, pEVar5 != pEVar1) {
    QTextCursor::operator=(&pEVar5[-1].cursor,&this[-1].cursor);
    QTextFormat::operator=(&pEVar5[-1].format.super_QTextFormat,&this[-1].format.super_QTextFormat);
    *(long *)d_first.current = *(long *)d_first.current + -0x18;
    this = (ExtraSelection *)(*(long *)first.current - 0x18);
    *(ExtraSelection **)first.current = this;
    pEVar5 = *d_first.current;
  }
  while (local_50.iter = prVar3, this != pEVar4) {
    *(ExtraSelection **)first.current = this + 1;
    QTextFormat::~QTextFormat(&(this->format).super_QTextFormat);
    QTextCursor::~QTextCursor(&this->cursor);
    prVar3 = local_50.iter;
    this = *first.current;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QTextEdit::ExtraSelection_*>,_long_long>::
  Destructor::~Destructor(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}